

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O2

void gf2RedTrinomial0(word *a,size_t n,gf2_trinom_st *p)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  
  uVar2 = n * 2;
  while( true ) {
    uVar3 = uVar2 - 1;
    uVar5 = a[uVar3];
    bVar4 = (byte)p->bm;
    if (uVar3 <= p->wm) break;
    a[(uVar2 - 2) - p->wm] = a[(uVar2 - 2) - p->wm] ^ uVar5 << (-bVar4 & 0x3f);
    a[uVar3 - p->wm] = a[uVar3 - p->wm] ^ uVar5 >> ((byte)p->bm & 0x3f);
    a[uVar3 - p->wk] = a[uVar3 - p->wk] ^ uVar5;
    uVar2 = uVar3;
  }
  uVar5 = uVar5 >> (bVar4 & 0x3f);
  *a = *a ^ uVar5;
  uVar5 = uVar5 << ((byte)p->bm & 0x3f);
  puVar1 = a + uVar3;
  puVar1[-p->wk] = puVar1[-p->wk] ^ uVar5;
  *puVar1 = *puVar1 ^ uVar5;
  return;
}

Assistant:

static void gf2RedTrinomial0(word a[], size_t n, const gf2_trinom_st* p)
{
	register word hi;
	// pre
	ASSERT(wwIsValid(a, 2 * n));
	ASSERT(memIsValid(p, sizeof(*p)));
	ASSERT(p->m % 8 != 0);
	ASSERT(p->m > p->k && p->k > 0);
	ASSERT(p->m - p->k >= B_PER_W);
	ASSERT(p->bm < B_PER_W && p->bk < B_PER_W);
	ASSERT(p->m == p->wm * B_PER_W + p->bm);
	ASSERT(p->m == p->k + p->wk * B_PER_W + p->bk);
	ASSERT(n == W_OF_B(p->m));
	ASSERT(p->bk == 0);
	// обработать старшие слова
	n *= 2;
	while (--n > p->wm)
	{
		hi = a[n];
		a[n - p->wm - 1] ^= hi << (B_PER_W - p->bm);
		a[n - p->wm] ^= hi >> p->bm;
		a[n - p->wk] ^= hi;
	}
	// слово, на которое попадает моном x^m
	ASSERT(n == p->wm);
	hi = a[n] >> p->bm;
	a[0] ^= hi;
	hi <<= p->bm;
	a[n - p->wk] ^= hi;
	a[n] ^= hi;
	// очистка
	hi = 0;
}